

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

void __thiscall doctest::String::String(String *this,char *in)

{
  size_t sVar1;
  char *pcVar2;
  char *in_local;
  String *this_local;
  
  sVar1 = detail::my_strlen(in);
  pcVar2 = (char *)malloc(sVar1 + 1);
  this->m_str = pcVar2;
  if (in == (char *)0x0) {
    *this->m_str = '\0';
  }
  else {
    strcpy(this->m_str,in);
  }
  return;
}

Assistant:

String::String(const char* in)
        : m_str(static_cast<char*>(malloc(detail::my_strlen(in) + 1))) {
    if(in)
        strcpy(m_str, in);
    else
        m_str[0] = '\0';
}